

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O1

void * metacallfv_s(void *func,void **args,size_t size)

{
  int iVar1;
  type_id tVar2;
  type_id tVar3;
  uint uVar4;
  uint uVar5;
  undefined8 in_RAX;
  signature s;
  type ptVar6;
  value pvVar7;
  signature v;
  signature psVar8;
  value unaff_RBX;
  size_t index;
  bool bVar9;
  
  if (func == (void *)0x0) {
    v = (signature)0x0;
  }
  else {
    s = function_signature((function_conflict)func);
    tVar2 = (type_id)((ulong)in_RAX >> 0x20);
    if (size != 0) {
      index = 0;
      do {
        iVar1 = value_validate(args[index]);
        if (iVar1 != 0) {
          log_write_impl_va("metacall",0x477,"metacallfv_s",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                            ,LOG_LEVEL_ERROR,
                            "Invalid argument at position %zu when calling to metacallfv_s",index);
          return (void *)0x0;
        }
        ptVar6 = signature_get_type(s,index);
        if (ptVar6 != (type)0x0) {
          tVar2 = type_index(ptVar6);
          tVar3 = value_type_id(args[index]);
          if ((tVar2 != tVar3) &&
             (pvVar7 = value_type_cast(unaff_RBX,(type_id)((ulong)in_RAX >> 0x20)),
             pvVar7 != (value)0x0)) {
            args[index] = pvVar7;
          }
        }
        tVar2 = (type_id)((ulong)in_RAX >> 0x20);
        index = index + 1;
      } while (size != index);
    }
    v = (signature)function_call((function_conflict)func,args,size);
    if (v != (signature)0x0) {
      ptVar6 = signature_get_return(s);
      if (ptVar6 == (type)0x0) {
        bVar9 = true;
      }
      else {
        uVar4 = type_index(ptVar6);
        uVar5 = value_type_id(v);
        bVar9 = uVar4 == uVar5;
        s = (signature)(ulong)uVar4;
        if ((!bVar9) &&
           (psVar8 = (signature)value_type_cast(unaff_RBX,tVar2), s = v, psVar8 != (signature)0x0))
        {
          s = psVar8;
        }
      }
      if (!bVar9) {
        return s;
      }
    }
  }
  return v;
}

Assistant:

void *metacallfv_s(void *func, void *args[], size_t size)
{
	function f = (function)func;

	if (f != NULL)
	{
		signature s = function_signature(f);

		size_t iterator;

		value ret;

		for (iterator = 0; iterator < size; ++iterator)
		{
			if (value_validate(args[iterator]) != 0)
			{
				// TODO: Implement type error return a value
				log_write("metacall", LOG_LEVEL_ERROR, "Invalid argument at position %" PRIuS " when calling to metacallfv_s", iterator);
				return NULL;
			}

			type t = signature_get_type(s, iterator);

			if (t != NULL)
			{
				type_id id = type_index(t);

				if (id != value_type_id((value)args[iterator]))
				{
					value cast_arg = value_type_cast((value)args[iterator], id);

					if (cast_arg != NULL)
					{
						args[iterator] = cast_arg;
					}
				}
			}
		}

		ret = function_call(f, args, size);

		if (ret != NULL)
		{
			type t = signature_get_return(s);

			if (t != NULL)
			{
				type_id id = type_index(t);

				if (id != value_type_id(ret))
				{
					value cast_ret = value_type_cast(ret, id);

					return (cast_ret == NULL) ? ret : cast_ret;
				}
			}
		}

		return ret;
	}

	return NULL;
}